

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O2

StringRef __thiscall
llvm::sys::detail::getHostCPUNameForARM(detail *this,StringRef ProcCpuinfoContent)

{
  ulong uVar1;
  void *pvVar2;
  long *plVar3;
  void *pvVar4;
  int iVar5;
  StringRef *pSVar6;
  char **ppcVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *__s1;
  bool bVar15;
  bool bVar16;
  StringRef Separator;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Chars_01;
  StringRef Chars_02;
  StringRef Chars_03;
  StringRef Chars_04;
  StringRef SVar17;
  StringRef SVar18;
  StringRef I;
  Optional<const_char_*> local_298;
  uint Part;
  uint Variant;
  int *local_280;
  StringRef local_278;
  StringRef local_268;
  size_t local_258;
  StringRef ProcCpuinfoContent_local;
  SmallVector<llvm::StringRef,_32U> Lines;
  
  ProcCpuinfoContent_local.Length = (size_t)ProcCpuinfoContent.Data;
  Lines.super_SmallVectorImpl<llvm::StringRef>.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       &Lines.super_SmallVectorStorage<llvm::StringRef,_32U>;
  Lines.super_SmallVectorImpl<llvm::StringRef>.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  Lines.super_SmallVectorImpl<llvm::StringRef>.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
  Separator.Length = 1;
  Separator.Data = "\n";
  ProcCpuinfoContent_local.Data = (char *)this;
  StringRef::split(&ProcCpuinfoContent_local,&Lines.super_SmallVectorImpl<llvm::StringRef>,Separator
                   ,-1,true);
  uVar14 = Lines.super_SmallVectorImpl<llvm::StringRef>.
           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
           0xffffffff;
  lVar10 = 8;
  local_268 = (StringRef)ZEXT816(0);
  SVar17 = (StringRef)ZEXT816(0);
  for (uVar13 = 0; local_258 = SVar17.Length, local_280 = (int *)SVar17.Data, uVar14 != uVar13;
      uVar13 = uVar13 + 1) {
    uVar12 = Lines.super_SmallVectorImpl<llvm::StringRef>.
             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff;
    if (uVar12 <= uVar13) {
LAB_0013d1dc:
      local_258 = SVar17.Length;
      local_280 = (int *)SVar17.Data;
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    uVar1 = *(ulong *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                             super_SmallVectorBase.BeginX + lVar10);
    if (0xe < uVar1) {
      pvVar2 = *(void **)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar10 + -8);
      iVar5 = bcmp(pvVar2,"CPU implementer",0xf);
      SVar17.Length = local_258;
      SVar17.Data = (char *)local_280;
      if (iVar5 == 0) {
        I.Length = uVar1 - 0xf;
        I.Data = (char *)((long)pvVar2 + 0xf);
        Chars.Length = 3;
        Chars.Data = "\t :";
        SVar17 = StringRef::ltrim(&I,Chars);
        uVar12 = Lines.super_SmallVectorImpl<llvm::StringRef>.
                 super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_
                 & 0xffffffff;
      }
    }
    local_258 = SVar17.Length;
    local_280 = (int *)SVar17.Data;
    if (uVar12 <= uVar13) goto LAB_0013d1dc;
    if (7 < *(ulong *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                             super_SmallVectorBase.BeginX + lVar10)) {
      plVar3 = *(long **)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar10 + -8);
      if (*plVar3 == 0x6572617764726148) {
        I.Length = *(ulong *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                                    super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                    super_SmallVectorBase.BeginX + lVar10) - 8;
        I.Data = (char *)(plVar3 + 1);
        Chars_00.Length = 3;
        Chars_00.Data = "\t :";
        local_268 = StringRef::ltrim(&I,Chars_00);
        SVar17.Length = local_258;
        SVar17.Data = (char *)local_280;
      }
    }
    lVar10 = lVar10 + 0x10;
  }
  if (local_258 != 4) {
    pcVar11 = "generic";
    sVar8 = 7;
    goto LAB_0013d1ba;
  }
  if (*local_280 == 0x31347830) {
    if (6 < local_268.Length) {
      __s1 = local_268.Data + (local_268.Length - 7);
      iVar5 = bcmp(__s1,"MSM8994",7);
      SVar17.Length = local_258;
      SVar17.Data = (char *)local_280;
      pcVar11 = "cortex-a53";
      sVar8 = 10;
      if (iVar5 == 0) goto LAB_0013d1ba;
      iVar5 = bcmp(__s1,"MSM8996",7);
      SVar17.Length = local_258;
      SVar17.Data = (char *)local_280;
      if (iVar5 == 0) goto LAB_0013d1ba;
    }
    local_258 = SVar17.Length;
    local_280 = (int *)SVar17.Data;
    for (lVar10 = 0;
        (Lines.super_SmallVectorImpl<llvm::StringRef>.
         super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) << 4 != lVar10; lVar10 = lVar10 + 0x10) {
      uVar13 = *(ulong *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar10 + 8);
      if ((7 < uVar13) &&
         (**(long **)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX + lVar10) == 0x7472617020555043)) {
        local_278.Length = uVar13 - 8;
        local_278.Data =
             (char *)(*(long **)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                       super_SmallVectorBase.BeginX + lVar10) + 1);
        Chars_04.Length = 3;
        Chars_04.Data = "\t :";
        I = StringRef::ltrim(&local_278,Chars_04);
        sVar9 = I.Length;
        pcVar11 = I.Data;
        local_298.Storage.hasVal = false;
        bVar15 = sVar9 == 5;
        if (bVar15) {
          iVar5 = bcmp(pcVar11,"0x926",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf723;
            local_298.Storage.hasVal = true;
            goto LAB_0013cf30;
          }
          iVar5 = bcmp(pcVar11,"0xb02",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf734;
            goto LAB_0013d18c;
          }
          bVar16 = false;
          bVar15 = false;
        }
        else {
LAB_0013cf30:
          bVar16 = sVar9 != 5;
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xb36",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf741;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xb56",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf752;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xb76",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf764;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xc08",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf776;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xc09",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf786;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xc0f",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf796;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xc20",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf7a7;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xc23",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf7b7;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xc24",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf7c7;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xd04",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf7d7;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xd03",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf709;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xd07",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf7ee;
            goto LAB_0013d18c;
          }
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xd08",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf7ff;
            goto LAB_0013d18c;
          }
        }
        if (bVar16 || bVar15) goto LAB_0013d0e6;
        iVar5 = bcmp(pcVar11,"0xd09",5);
        if (iVar5 != 0) goto LAB_0013d0e6;
        goto LAB_0013d0fb;
      }
    }
  }
  pvVar2 = Lines.super_SmallVectorImpl<llvm::StringRef>.
           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  local_258 = SVar17.Length;
  local_280 = (int *)SVar17.Data;
  if (*local_280 == 0x31357830) {
    for (lVar10 = 0;
        (Lines.super_SmallVectorImpl<llvm::StringRef>.
         super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) << 4 != lVar10; lVar10 = lVar10 + 0x10) {
      uVar13 = *(ulong *)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar10 + 8);
      if ((7 < uVar13) &&
         (**(long **)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX + lVar10) == 0x7472617020555043)) {
        local_278.Length = uVar13 - 8;
        local_278.Data =
             (char *)(*(long **)((long)Lines.super_SmallVectorImpl<llvm::StringRef>.
                                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                       super_SmallVectorBase.BeginX + lVar10) + 1);
        Chars_03.Length = 3;
        Chars_03.Data = "\t :";
        I = StringRef::ltrim(&local_278,Chars_03);
        sVar9 = I.Length;
        pcVar11 = I.Data;
        local_298.Storage.hasVal = false;
        bVar15 = sVar9 == 5;
        if (bVar15) {
          iVar5 = bcmp(pcVar11,"0x06f",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf826;
            local_298.Storage.hasVal = true;
            goto LAB_0013ce41;
          }
          iVar5 = bcmp(pcVar11,"0x201",5);
          if (iVar5 != 0) {
            bVar16 = false;
            bVar15 = false;
            goto LAB_0013ce49;
          }
LAB_0013cf13:
          local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
               (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf832;
          goto LAB_0013d18c;
        }
LAB_0013ce41:
        bVar16 = sVar9 != 5;
LAB_0013ce49:
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0x205",5);
          if (iVar5 == 0) goto LAB_0013cf13;
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0x211",5);
          if (iVar5 == 0) goto LAB_0013cf13;
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0x800",5);
          if (iVar5 == 0) goto LAB_0013d0fb;
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0x801",5);
          if (iVar5 == 0) goto LAB_0013d0fb;
        }
        if (!bVar16 && !bVar15) {
          iVar5 = bcmp(pcVar11,"0xc00",5);
          if (iVar5 == 0) {
            local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
                 (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf855;
            goto LAB_0013d18c;
          }
        }
        if (bVar16 || bVar15) goto LAB_0013d0e6;
        iVar5 = bcmp(pcVar11,"0xc01",5);
        if (iVar5 != 0) goto LAB_0013d0e6;
        local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
             (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf862;
        goto LAB_0013d18c;
      }
    }
  }
  pcVar11 = "generic";
  sVar8 = 7;
  if (*local_280 == 0x33357830) {
    Variant = 0;
    Part = 0;
    uVar13 = Lines.super_SmallVectorImpl<llvm::StringRef>.
             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff;
    for (lVar10 = 0;
        pvVar4 = Lines.super_SmallVectorImpl<llvm::StringRef>.
                 super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX
        , local_258 = SVar17.Length, local_280 = (int *)SVar17.Data, uVar13 << 4 != lVar10;
        lVar10 = lVar10 + 0x10) {
      pSVar6 = (StringRef *)((long)pvVar2 + lVar10);
      pcVar11 = pSVar6->Data;
      uVar14 = pSVar6->Length;
      I = *pSVar6;
      if (10 < uVar14) {
        iVar5 = bcmp(pcVar11,"CPU variant",0xb);
        SVar17.Length = local_258;
        SVar17.Data = (char *)local_280;
        if (iVar5 == 0) {
          I.Length = uVar14 - 0xb;
          I.Data = pcVar11 + 0xb;
          Chars_01.Length = 3;
          Chars_01.Data = "\t :";
          local_278 = StringRef::ltrim(&I,Chars_01);
          StringRef::getAsInteger<unsigned_int>(&local_278,0,&Variant);
          SVar17.Length = local_258;
          SVar17.Data = (char *)local_280;
        }
      }
    }
    uVar13 = Lines.super_SmallVectorImpl<llvm::StringRef>.
             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff;
    for (lVar10 = 0; local_258 = SVar17.Length, local_280 = (int *)SVar17.Data,
        uVar13 << 4 != lVar10; lVar10 = lVar10 + 0x10) {
      pSVar6 = (StringRef *)(lVar10 + (long)pvVar4);
      I = *pSVar6;
      if ((7 < pSVar6->Length) && (*(long *)pSVar6->Data == 0x7472617020555043)) {
        I.Length = pSVar6->Length - 8;
        I.Data = (char *)((long)pSVar6->Data + 8);
        Chars_02.Length = 3;
        Chars_02.Data = "\t :";
        local_278 = StringRef::ltrim(&I,Chars_02);
        StringRef::getAsInteger<unsigned_int>(&local_278,0,&Part);
        SVar17.Length = local_258;
        SVar17.Data = (char *)local_280;
      }
    }
    pcVar11 = "exynos-m1";
    if ((Variant << 0xc | Part) == 0x4001) {
      pcVar11 = "exynos-m2";
    }
    sVar8 = 9;
  }
  goto LAB_0013d1ba;
LAB_0013d0e6:
  if (bVar15) goto LAB_0013d196;
  pcVar11 = "generic";
  goto LAB_0013d1a8;
LAB_0013d0fb:
  local_298.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
       (AlignedCharArray<8UL,_8UL>)(char  [8])0x1bf810;
LAB_0013d18c:
  local_298.Storage.hasVal = true;
LAB_0013d196:
  ppcVar7 = Optional<const_char_*>::getPointer(&local_298);
  SVar17.Length = local_258;
  SVar17.Data = (char *)local_280;
  pcVar11 = *ppcVar7;
  if (pcVar11 == (char *)0x0) {
    pcVar11 = (char *)0x0;
    sVar8 = 0;
    goto LAB_0013d1ba;
  }
LAB_0013d1a8:
  sVar8 = strlen(pcVar11);
  SVar17.Length = local_258;
  SVar17.Data = (char *)local_280;
LAB_0013d1ba:
  local_258 = SVar17.Length;
  local_280 = (int *)SVar17.Data;
  SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl(&Lines.super_SmallVectorImpl<llvm::StringRef>);
  SVar18.Length = sVar8;
  SVar18.Data = pcVar11;
  return SVar18;
}

Assistant:

StringRef sys::detail::getHostCPUNameForARM(StringRef ProcCpuinfoContent) {
  // The cpuid register on arm is not accessible from user space. On Linux,
  // it is exposed through the /proc/cpuinfo file.

  // Read 32 lines from /proc/cpuinfo, which should contain the CPU part line
  // in all cases.
  SmallVector<StringRef, 32> Lines;
  ProcCpuinfoContent.split(Lines, "\n");

  // Look for the CPU implementer line.
  StringRef Implementer;
  StringRef Hardware;
  for (unsigned I = 0, E = Lines.size(); I != E; ++I) {
    if (Lines[I].startswith("CPU implementer"))
      Implementer = Lines[I].substr(15).ltrim("\t :");
    if (Lines[I].startswith("Hardware"))
      Hardware = Lines[I].substr(8).ltrim("\t :");
  }

  if (Implementer == "0x41") { // ARM Ltd.
    // MSM8992/8994 may give cpu part for the core that the kernel is running on,
    // which is undeterministic and wrong. Always return cortex-a53 for these SoC.
    if (Hardware.endswith("MSM8994") || Hardware.endswith("MSM8996"))
      return "cortex-a53";


    // Look for the CPU part line.
    for (unsigned I = 0, E = Lines.size(); I != E; ++I)
      if (Lines[I].startswith("CPU part"))
        // The CPU part is a 3 digit hexadecimal number with a 0x prefix. The
        // values correspond to the "Part number" in the CP15/c0 register. The
        // contents are specified in the various processor manuals.
        return StringSwitch<const char *>(Lines[I].substr(8).ltrim("\t :"))
            .Case("0x926", "arm926ej-s")
            .Case("0xb02", "mpcore")
            .Case("0xb36", "arm1136j-s")
            .Case("0xb56", "arm1156t2-s")
            .Case("0xb76", "arm1176jz-s")
            .Case("0xc08", "cortex-a8")
            .Case("0xc09", "cortex-a9")
            .Case("0xc0f", "cortex-a15")
            .Case("0xc20", "cortex-m0")
            .Case("0xc23", "cortex-m3")
            .Case("0xc24", "cortex-m4")
            .Case("0xd04", "cortex-a35")
            .Case("0xd03", "cortex-a53")
            .Case("0xd07", "cortex-a57")
            .Case("0xd08", "cortex-a72")
            .Case("0xd09", "cortex-a73")
            .Default("generic");
  }

  if (Implementer == "0x51") // Qualcomm Technologies, Inc.
    // Look for the CPU part line.
    for (unsigned I = 0, E = Lines.size(); I != E; ++I)
      if (Lines[I].startswith("CPU part"))
        // The CPU part is a 3 digit hexadecimal number with a 0x prefix. The
        // values correspond to the "Part number" in the CP15/c0 register. The
        // contents are specified in the various processor manuals.
        return StringSwitch<const char *>(Lines[I].substr(8).ltrim("\t :"))
            .Case("0x06f", "krait") // APQ8064
            .Case("0x201", "kryo")
            .Case("0x205", "kryo")
            .Case("0x211", "kryo")
            .Case("0x800", "cortex-a73")
            .Case("0x801", "cortex-a73")
            .Case("0xc00", "falkor")
            .Case("0xc01", "saphira")
            .Default("generic");

  if (Implementer == "0x53") { // Samsung Electronics Co., Ltd.
    // The Exynos chips have a convoluted ID scheme that doesn't seem to follow
    // any predictive pattern across variants and parts.
    unsigned Variant = 0, Part = 0;

    // Look for the CPU variant line, whose value is a 1 digit hexadecimal
    // number, corresponding to the Variant bits in the CP15/C0 register.
    for (auto I : Lines)
      if (I.consume_front("CPU variant"))
        I.ltrim("\t :").getAsInteger(0, Variant);

    // Look for the CPU part line, whose value is a 3 digit hexadecimal
    // number, corresponding to the PartNum bits in the CP15/C0 register.
    for (auto I : Lines)
      if (I.consume_front("CPU part"))
        I.ltrim("\t :").getAsInteger(0, Part);

    unsigned Exynos = (Variant << 12) | Part;
    switch (Exynos) {
    default:
      // Default by falling through to Exynos M1.
      LLVM_FALLTHROUGH;

    case 0x1001:
      return "exynos-m1";

    case 0x4001:
      return "exynos-m2";
    }
  }

  return "generic";
}